

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesDelegate::TimeZoneNamesDelegate
          (TimeZoneNamesDelegate *this,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  char *__s;
  TimeZoneNamesImpl *this_00;
  size_t sVar2;
  char *size;
  UDate UVar3;
  TimeZoneNamesImpl *local_98;
  char *local_58;
  char *newKey;
  TimeZoneNames *tznames;
  char *key;
  TimeZoneNamesCacheEntry *cacheEntry;
  Mutex local_28;
  Mutex lock;
  UErrorCode *status_local;
  Locale *locale_local;
  TimeZoneNamesDelegate *this_local;
  
  lock.fMutex = (UMutex *)status;
  TimeZoneNames::TimeZoneNames(&this->super_TimeZoneNames);
  (this->super_TimeZoneNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TimeZoneNamesDelegate_004a8da0;
  Mutex::Mutex(&local_28,(UMutex *)gTimeZoneNamesLock);
  if (gTimeZoneNamesCacheInitialized == '\0') {
    gTimeZoneNamesCache =
         uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                       (UErrorCode *)lock.fMutex);
    UVar1 = ::U_SUCCESS(((lock.fMutex)->fMutex).__data.__lock);
    if (UVar1 != '\0') {
      uhash_setKeyDeleter_63(gTimeZoneNamesCache,uprv_free_63);
      uhash_setValueDeleter_63(gTimeZoneNamesCache,deleteTimeZoneNamesCacheEntry);
      gTimeZoneNamesCacheInitialized = '\x01';
      ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONENAMES,timeZoneNames_cleanup);
    }
  }
  UVar1 = ::U_FAILURE(((lock.fMutex)->fMutex).__data.__lock);
  if (UVar1 == '\0') {
    __s = Locale::getName(locale);
    size = __s;
    key = (char *)uhash_get_63(gTimeZoneNamesCache,__s);
    if (key == (char *)0x0) {
      local_58 = (char *)0x0;
      this_00 = (TimeZoneNamesImpl *)UMemory::operator_new((UMemory *)0x140,(size_t)size);
      local_98 = (TimeZoneNamesImpl *)0x0;
      if (this_00 != (TimeZoneNamesImpl *)0x0) {
        TimeZoneNamesImpl::TimeZoneNamesImpl(this_00,locale,(UErrorCode *)lock.fMutex);
        local_98 = this_00;
      }
      if (local_98 == (TimeZoneNamesImpl *)0x0) {
        ((lock.fMutex)->fMutex).__data.__lock = 7;
      }
      UVar1 = ::U_SUCCESS(((lock.fMutex)->fMutex).__data.__lock);
      if (UVar1 != '\0') {
        sVar2 = strlen(__s);
        local_58 = (char *)uprv_malloc_63(sVar2 + 1);
        if (local_58 == (char *)0x0) {
          ((lock.fMutex)->fMutex).__data.__lock = 7;
        }
        else {
          strcpy(local_58,__s);
        }
      }
      UVar1 = ::U_SUCCESS(((lock.fMutex)->fMutex).__data.__lock);
      if (UVar1 != '\0') {
        key = (char *)uprv_malloc_63(0x18);
        if (key == (char *)0x0) {
          ((lock.fMutex)->fMutex).__data.__lock = 7;
        }
        else {
          *(TimeZoneNamesImpl **)key = local_98;
          key[8] = '\x01';
          key[9] = '\0';
          key[10] = '\0';
          key[0xb] = '\0';
          UVar3 = uprv_getUTCtime_63();
          *(UDate *)(key + 0x10) = UVar3;
          uhash_put_63(gTimeZoneNamesCache,local_58,key,(UErrorCode *)lock.fMutex);
        }
      }
      UVar1 = ::U_FAILURE(((lock.fMutex)->fMutex).__data.__lock);
      if (UVar1 != '\0') {
        if ((local_98 != (TimeZoneNamesImpl *)0x0) && (local_98 != (TimeZoneNamesImpl *)0x0)) {
          (*(local_98->super_TimeZoneNames).super_UObject._vptr_UObject[1])();
        }
        if (local_58 != (char *)0x0) {
          uprv_free_63(local_58);
        }
        if (key != (char *)0x0) {
          uprv_free_63(key);
        }
        key = (char *)0x0;
      }
    }
    else {
      *(int *)(key + 8) = *(int *)(key + 8) + 1;
      UVar3 = uprv_getUTCtime_63();
      *(UDate *)(key + 0x10) = UVar3;
    }
    gAccessCount = gAccessCount + 1;
    if (99 < gAccessCount) {
      sweepCache();
      gAccessCount = 0;
    }
    this->fTZnamesCacheEntry = (TimeZoneNamesCacheEntry *)key;
  }
  Mutex::~Mutex(&local_28);
  return;
}

Assistant:

TimeZoneNamesDelegate::TimeZoneNamesDelegate(const Locale& locale, UErrorCode& status) {
    Mutex lock(&gTimeZoneNamesLock);
    if (!gTimeZoneNamesCacheInitialized) {
        // Create empty hashtable if it is not already initialized.
        gTimeZoneNamesCache = uhash_open(uhash_hashChars, uhash_compareChars, NULL, &status);
        if (U_SUCCESS(status)) {
            uhash_setKeyDeleter(gTimeZoneNamesCache, uprv_free);
            uhash_setValueDeleter(gTimeZoneNamesCache, deleteTimeZoneNamesCacheEntry);
            gTimeZoneNamesCacheInitialized = TRUE;
            ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONENAMES, timeZoneNames_cleanup);
        }
    }

    if (U_FAILURE(status)) {
        return;
    }

    // Check the cache, if not available, create new one and cache
    TimeZoneNamesCacheEntry *cacheEntry = NULL;

    const char *key = locale.getName();
    cacheEntry = (TimeZoneNamesCacheEntry *)uhash_get(gTimeZoneNamesCache, key);
    if (cacheEntry == NULL) {
        TimeZoneNames *tznames = NULL;
        char *newKey = NULL;

        tznames = new TimeZoneNamesImpl(locale, status);
        if (tznames == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
        if (U_SUCCESS(status)) {
            newKey = (char *)uprv_malloc(uprv_strlen(key) + 1);
            if (newKey == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                uprv_strcpy(newKey, key);
            }
        }
        if (U_SUCCESS(status)) {
            cacheEntry = (TimeZoneNamesCacheEntry *)uprv_malloc(sizeof(TimeZoneNamesCacheEntry));
            if (cacheEntry == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                cacheEntry->names = tznames;
                cacheEntry->refCount = 1;
                cacheEntry->lastAccess = (double)uprv_getUTCtime();

                uhash_put(gTimeZoneNamesCache, newKey, cacheEntry, &status);
            }
        }
        if (U_FAILURE(status)) {
            if (tznames != NULL) {
                delete tznames;
            }
            if (newKey != NULL) {
                uprv_free(newKey);
            }
            if (cacheEntry != NULL) {
                uprv_free(cacheEntry);
            }
            cacheEntry = NULL;
        }
    } else {
        // Update the reference count
        cacheEntry->refCount++;
        cacheEntry->lastAccess = (double)uprv_getUTCtime();
    }
    gAccessCount++;
    if (gAccessCount >= SWEEP_INTERVAL) {
        // sweep
        sweepCache();
        gAccessCount = 0;
    }
    fTZnamesCacheEntry = cacheEntry;
}